

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_rms_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  char cVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  float *y;
  int64_t i01;
  long lVar24;
  float fVar25;
  double dVar26;
  long local_f0;
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xca9,"fatal error");
  }
  cVar16 = ggml_are_same_shape(pgVar4);
  if (cVar16 == '\0') {
    pcVar19 = "ggml_are_same_shape(src0, dst)";
    uVar21 = 0xc72;
  }
  else if (pgVar4->nb[0] == 4) {
    fVar1 = (float)dst->op_params[0];
    if (0.0 <= fVar1) {
      sVar5 = dst->nb[1];
      sVar6 = pgVar4->nb[3];
      uVar7 = pgVar4->ne[0];
      sVar8 = pgVar4->nb[1];
      iVar2 = params->nth;
      iVar3 = params->ith;
      lVar9 = pgVar4->ne[1];
      sVar10 = pgVar4->nb[2];
      sVar11 = dst->nb[3];
      sVar12 = dst->nb[2];
      uVar13 = pgVar4->ne[3];
      local_f0 = sVar8 * (long)iVar3;
      uVar14 = pgVar4->ne[2];
      for (uVar18 = 0; uVar18 != (~((long)uVar13 >> 0x3f) & uVar13); uVar18 = uVar18 + 1) {
        lVar23 = local_f0;
        for (uVar20 = 0; uVar20 != (~((long)uVar14 >> 0x3f) & uVar14); uVar20 = uVar20 + 1) {
          lVar22 = lVar23;
          for (lVar24 = (long)iVar3; lVar24 < lVar9; lVar24 = lVar24 + iVar2) {
            dVar26 = 0.0;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              fVar25 = *(float *)((long)pgVar4->data + uVar17 * 4 + lVar22);
              dVar26 = dVar26 + (double)(fVar25 * fVar25);
            }
            y = (float *)((long)dst->data + uVar20 * sVar12 + uVar18 * sVar11 + lVar24 * sVar5);
            memcpy(y,(void *)(lVar24 * sVar8 + uVar20 * sVar10 + uVar18 * sVar6 + (long)pgVar4->data
                             ),uVar7 * 4);
            fVar25 = (float)(dVar26 / (double)(long)uVar7) + fVar1;
            if (fVar25 < 0.0) {
              fVar25 = sqrtf(fVar25);
            }
            else {
              auVar15 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
              fVar25 = auVar15._0_4_;
            }
            ggml_vec_scale_f32((int)uVar7,y,1.0 / fVar25);
            lVar22 = lVar22 + sVar8 * (long)iVar2;
          }
          lVar23 = lVar23 + sVar10;
        }
        local_f0 = local_f0 + sVar6;
      }
      return;
    }
    pcVar19 = "eps >= 0.0f";
    uVar21 = 0xc7e;
  }
  else {
    pcVar19 = "src0->nb[0] == sizeof(float)";
    uVar21 = 0xc74;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar21,"GGML_ASSERT(%s) failed",pcVar19);
}

Assistant:

void ggml_compute_forward_rms_norm(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_rms_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}